

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_row.hpp
# Opt level: O3

bool __thiscall csv::CSVField::operator==(CSVField *this,char *other)

{
  size_t __n;
  char *__s1;
  bool bVar1;
  int iVar2;
  size_t sVar3;
  size_type __rlen;
  
  __n = (this->sv)._M_len;
  __s1 = (this->sv)._M_str;
  sVar3 = strlen(other);
  if (__n == sVar3) {
    if (__n != 0) {
      iVar2 = bcmp(__s1,other,__n);
      if (iVar2 != 0) goto LAB_00128f68;
    }
    bVar1 = true;
  }
  else {
LAB_00128f68:
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

CONSTEXPR bool CSVField::operator==(const char * other) const noexcept
    {
        return this->sv == other;
    }